

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef expr,uint8_t *mask)

{
  uintptr_t uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  
  if (expr->_id != SIMDShuffleId) {
    __assert_fail("expression->is<SIMDShuffle>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xcb2,"void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef, uint8_t *)");
  }
  if (mask != (uint8_t *)0x0) {
    uVar2 = expr[2].field_0x1;
    uVar3 = expr[2].field_0x2;
    uVar4 = expr[2].field_0x3;
    uVar5 = expr[2].field_0x4;
    uVar6 = expr[2].field_0x5;
    uVar7 = expr[2].field_0x6;
    uVar8 = expr[2].field_0x7;
    uVar1 = expr[2].type.id;
    mask[0] = expr[2]._id;
    mask[1] = uVar2;
    mask[2] = uVar3;
    mask[3] = uVar4;
    mask[4] = uVar5;
    mask[5] = uVar6;
    mask[6] = uVar7;
    mask[7] = uVar8;
    *(uintptr_t *)(mask + 8) = uVar1;
    return;
  }
  __assert_fail("mask",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xcb3,"void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef, uint8_t *)");
}

Assistant:

void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef expr, uint8_t* mask) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShuffle>());
  assert(mask); // nullptr would be wrong
  memcpy(mask, static_cast<SIMDShuffle*>(expression)->mask.data(), 16);
}